

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int resolveSelectStep(Walker *pWalker,Select *p)

{
  byte *pbVar1;
  u8 uVar2;
  Parse *pParse;
  NameContext *pOuterNC;
  sqlite3 *psVar3;
  SrcList *pSVar4;
  Select *pSVar5;
  char *pcVar6;
  ExprList *pEVar7;
  sqlite3 *psVar8;
  Expr *pEVar9;
  sqlite3 *psVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  NameContext *pNVar16;
  Expr *p_00;
  Expr *pEVar17;
  ExprList_item *pEVar18;
  ulong uVar19;
  ulong uVar20;
  Expr *pE;
  Expr *pEVar21;
  ulong uVar22;
  long lVar23;
  char *pcVar24;
  long lVar25;
  ExprList_item *pEVar26;
  Parse *pPVar27;
  Parse *pPVar28;
  bool bVar29;
  NameContext sNC;
  int local_d4;
  sqlite3 *local_d0;
  Select *local_c8;
  Expr *local_c0;
  Expr *local_b8;
  NameContext local_b0;
  sqlite3 *local_78;
  ExprList_item *local_70;
  NameContext local_68;
  
  iVar12 = 1;
  if ((p->selFlags & 4) == 0) {
    pParse = pWalker->pParse;
    pOuterNC = (pWalker->u).pNC;
    psVar3 = pParse->db;
    if ((p->selFlags & 0x40) == 0) {
      sqlite3SelectPrep(pParse,p,pOuterNC);
      iVar12 = 2;
      if (pParse->nErr == 0) {
        iVar12 = 2 - (uint)(psVar3->mallocFailed == '\0');
      }
    }
    else {
      local_c8 = p->pPrior;
      iVar12 = 0;
      local_d0 = (sqlite3 *)p;
      for (; p != (Select *)0x0; p = p->pPrior) {
        *(byte *)&p->selFlags = (byte)p->selFlags | 4;
        local_b0.nRef = 0;
        local_b0.nErr = 0;
        local_b0.ncFlags = 0;
        local_b0._50_6_ = 0;
        local_b0.pAggInfo = (AggInfo *)0x0;
        local_b0.pNext = (NameContext *)0x0;
        local_b0.pSrcList = (SrcList *)0x0;
        local_b0.pEList = (ExprList *)0x0;
        local_b0.pParse = pParse;
        iVar13 = sqlite3ResolveExprNames(&local_b0,p->pLimit);
        if ((iVar13 != 0) || (iVar13 = sqlite3ResolveExprNames(&local_b0,p->pOffset), iVar13 != 0))
        goto LAB_0015aa82;
        if ((p->selFlags & 0x10000) != 0) {
          (p->pSrc->a[0].pSelect)->pOrderBy = p->pOrderBy;
          p->pOrderBy = (ExprList *)0x0;
        }
        for (lVar25 = 0; pSVar4 = p->pSrc, lVar25 < pSVar4->nSrc; lVar25 = lVar25 + 1) {
          pSVar5 = pSVar4->a[lVar25].pSelect;
          if (pSVar5 != (Select *)0x0) {
            pcVar24 = pParse->zAuthContext;
            iVar13 = 0;
            for (pNVar16 = pOuterNC; pNVar16 != (NameContext *)0x0; pNVar16 = pNVar16->pNext) {
              iVar13 = iVar13 + pNVar16->nRef;
            }
            pcVar6 = pSVar4->a[lVar25].zName;
            if (pcVar6 != (char *)0x0) {
              pParse->zAuthContext = pcVar6;
            }
            sqlite3ResolveSelectNames(pParse,pSVar5,pOuterNC);
            pParse->zAuthContext = pcVar24;
            if ((pParse->nErr != 0) || (pNVar16 = pOuterNC, psVar3->mallocFailed != '\0'))
            goto LAB_0015aa82;
            for (; pNVar16 != (NameContext *)0x0; pNVar16 = pNVar16->pNext) {
              iVar13 = iVar13 - pNVar16->nRef;
            }
            pSVar4->a[lVar25].fg.field_0x1 =
                 pSVar4->a[lVar25].fg.field_0x1 & 0xf7 | (iVar13 != 0) << 3;
          }
        }
        local_b0.ncFlags = 1;
        local_b0.pSrcList = pSVar4;
        local_b0.pNext = pOuterNC;
        iVar13 = sqlite3ResolveExprListNames(&local_b0,p->pEList);
        if (iVar13 != 0) goto LAB_0015aa82;
        pEVar7 = p->pGroupBy;
        if ((byte)((byte)((local_b0.ncFlags & 0x10) >> 4) | pEVar7 != (ExprList *)0x0) == 1) {
          p->selFlags = local_b0.ncFlags & 0x1000 | p->selFlags | 8;
        }
        else {
          local_b0._48_8_ = local_b0._48_8_ & 0xffffffffffffffee;
        }
        if (p->pHaving != (Expr *)0x0 && pEVar7 == (ExprList *)0x0) {
          pcVar24 = "a GROUP BY clause is required before HAVING";
          goto LAB_0015aa7b;
        }
        local_b0.pEList = p->pEList;
        iVar13 = sqlite3ResolveExprNames(&local_b0,p->pHaving);
        if ((iVar13 != 0) || (iVar13 = sqlite3ResolveExprNames(&local_b0,p->pWhere), iVar13 != 0))
        goto LAB_0015aa82;
        lVar25 = 0x68;
        for (lVar23 = 0; pSVar4 = p->pSrc, lVar23 < pSVar4->nSrc; lVar23 = lVar23 + 1) {
          if (((*(byte *)((long)pSVar4->a + lVar25 + -0x2b) & 4) != 0) &&
             (iVar13 = sqlite3ResolveExprListNames
                                 (&local_b0,*(ExprList **)((long)pSVar4->a + lVar25 + -8)),
             iVar13 != 0)) goto LAB_0015aa82;
          lVar25 = lVar25 + 0x70;
        }
        local_b0.pNext = (NameContext *)0x0;
        local_b0._48_8_ = local_b0._48_8_ | 1;
        if ((p->selFlags & 0x10000) != 0) {
          pSVar5 = pSVar4->a[0].pSelect;
          p->pOrderBy = pSVar5->pOrderBy;
          pSVar5->pOrderBy = (ExprList *)0x0;
        }
        if (((local_c8 == (Select *)0x0 || iVar12 != 0) &&
            (iVar13 = resolveOrderGroupBy(&local_b0,p,p->pOrderBy,"ORDER"), iVar13 != 0)) ||
           (psVar3->mallocFailed != '\0')) goto LAB_0015aa82;
        if (pEVar7 != (ExprList *)0x0) {
          iVar13 = resolveOrderGroupBy(&local_b0,p,pEVar7,"GROUP");
          if ((iVar13 != 0) || (psVar3->mallocFailed != '\0')) goto LAB_0015aa82;
          iVar13 = pEVar7->nExpr;
          pEVar26 = pEVar7->a;
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          while (bVar29 = iVar13 != 0, iVar13 = iVar13 + -1, bVar29) {
            if ((pEVar26->pExpr->flags & 2) != 0) {
              pcVar24 = "aggregate functions are not allowed in the GROUP BY clause";
              goto LAB_0015aa7b;
            }
            pEVar26 = pEVar26 + 1;
          }
        }
        pSVar5 = p->pNext;
        if ((pSVar5 != (Select *)0x0) && (p->pEList->nExpr != pSVar5->pEList->nExpr)) {
          if ((pSVar5->selFlags & 0x200) == 0) {
            bVar11 = pSVar5->op + 0x8c;
            if (bVar11 < 3) {
              pcVar24 = (&PTR_anon_var_dwarf_2e418_00199d88)[bVar11];
            }
            else {
              pcVar24 = "UNION";
            }
            sqlite3ErrorMsg(pParse,
                            "SELECTs to the left and right of %s do not have the same number of result columns"
                            ,pcVar24);
            return 2;
          }
          pcVar24 = "all VALUES must have the same number of terms";
          goto LAB_0015aa7b;
        }
        iVar12 = iVar12 + 1;
      }
      if (local_c8 == (Select *)0x0) {
        iVar12 = 1;
      }
      else {
        pEVar7 = *(ExprList **)&local_d0->openFlags;
        iVar12 = 1;
        if (pEVar7 != (ExprList *)0x0) {
          psVar3 = pParse->db;
          uVar15 = pEVar7->nExpr;
          if (psVar3->aLimit[2] < (int)uVar15) {
            pcVar24 = "too many terms in ORDER BY clause";
LAB_0015aa7b:
            sqlite3ErrorMsg(pParse,pcVar24);
LAB_0015aa82:
            iVar12 = 2;
          }
          else {
            local_70 = pEVar7->a;
            lVar25 = 0;
            uVar20 = 0;
            if (0 < (int)uVar15) {
              uVar20 = (ulong)uVar15;
            }
            for (; uVar20 * 0x20 != lVar25; lVar25 = lVar25 + 0x20) {
              pbVar1 = &pEVar7->a[0].field_0x19 + lVar25;
              *pbVar1 = *pbVar1 & 0xfe;
            }
            psVar8 = local_d0;
            pPVar27 = (Parse *)0x0;
            do {
              pPVar28 = (Parse *)psVar8;
              *(Parse **)&pPVar28->nLabel = pPVar27;
              psVar8 = (sqlite3 *)*(Parse **)&pPVar28->iCacheLevel;
              pPVar27 = pPVar28;
            } while (*(Parse **)&pPVar28->iCacheLevel != (Parse *)0x0);
            iVar12 = 1;
            while ((pPVar28 != (Parse *)0x0 && (iVar12 != 0))) {
              local_d0 = pPVar28->db;
              iVar12 = 0;
              pEVar26 = local_70;
              for (iVar13 = 0; iVar13 < (int)uVar15; iVar13 = iVar13 + 1) {
                local_d4 = -1;
                if ((pEVar26->field_0x19 & 1) == 0) {
                  local_c8 = (Select *)CONCAT44(local_c8._4_4_,iVar12);
                  p_00 = sqlite3ExprSkipCollate(pEVar26->pExpr);
                  iVar12 = sqlite3ExprIsInteger(p_00,&local_d4);
                  if (iVar12 == 0) {
                    iVar14 = resolveAsName((Parse *)local_d0,(ExprList *)p_00,pE);
                    if (iVar14 == 0) {
                      pEVar17 = sqlite3ExprDup(psVar3,p_00,0);
                      iVar14 = 0;
                      if (psVar3->mallocFailed == '\0') {
                        local_78 = pPVar28->db;
                        local_68.nRef = 0;
                        local_68.nErr = 0;
                        local_68.pAggInfo = (AggInfo *)0x0;
                        local_68.pNext = (NameContext *)0x0;
                        local_68.pSrcList = *(SrcList **)&pPVar28->isMultiWrite;
                        local_68.ncFlags = 1;
                        local_68._50_6_ = 0;
                        psVar8 = pParse->db;
                        uVar2 = psVar8->suppressErr;
                        psVar8->suppressErr = '\x01';
                        local_b8 = pEVar17;
                        local_68.pParse = pParse;
                        local_68.pEList = (ExprList *)local_78;
                        iVar12 = sqlite3ResolveExprNames(&local_68,pEVar17);
                        psVar10 = local_78;
                        psVar8->suppressErr = uVar2;
                        pEVar17 = local_b8;
                        iVar14 = 0;
                        if (iVar12 == 0) {
                          pEVar18 = (ExprList_item *)&local_78->pVdbe;
                          local_c0 = p_00;
                          for (lVar25 = 0; p_00 = local_c0, pEVar17 = local_b8, iVar14 = 0,
                              lVar25 < *(int *)&psVar10->pVfs; lVar25 = lVar25 + 1) {
                            uVar15 = sqlite3ExprCompare((Parse *)0x0,pEVar18->pExpr,local_b8,-1);
                            if (uVar15 < 2) {
                              p_00 = local_c0;
                              pEVar17 = local_b8;
                              iVar14 = (int)lVar25 + 1;
                              break;
                            }
                            pEVar18 = pEVar18 + 1;
                          }
                        }
                      }
                      sqlite3ExprDelete(psVar3,pEVar17);
                    }
                    iVar12 = 1;
                    if (iVar14 < 1) goto LAB_0015ad37;
                  }
                  else if ((local_d4 < 1) || (iVar14 = local_d4, *(int *)&local_d0->pVfs < local_d4)
                          ) {
                    resolveOutOfRangeError(pParse,"ORDER",iVar13 + 1,*(int *)&local_d0->pVfs);
                    goto LAB_0015aa82;
                  }
                  pEVar17 = sqlite3Expr(psVar3,0x86,(char *)0x0);
                  if (pEVar17 == (Expr *)0x0) goto LAB_0015aa82;
                  pbVar1 = (byte *)((long)&pEVar17->flags + 1);
                  *pbVar1 = *pbVar1 | 4;
                  (pEVar17->u).iValue = iVar14;
                  pEVar18 = pEVar26;
                  pEVar9 = pEVar26->pExpr;
                  if (pEVar26->pExpr != p_00) {
                    do {
                      pEVar21 = pEVar9;
                      pEVar9 = pEVar21->pLeft;
                    } while (pEVar9->op == '^');
                    pEVar18 = (ExprList_item *)&pEVar21->pLeft;
                  }
                  pEVar18->pExpr = pEVar17;
                  sqlite3ExprDelete(psVar3,p_00);
                  (pEVar26->u).x.iOrderByCol = (u16)iVar14;
                  pEVar26->field_0x19 = pEVar26->field_0x19 | 1;
                  iVar12 = (int)local_c8;
                }
LAB_0015ad37:
                pEVar26 = pEVar26 + 1;
                uVar15 = pEVar7->nExpr;
              }
              pPVar28 = *(Parse **)&pPVar28->nLabel;
            }
            uVar19 = 0;
            uVar20 = (ulong)uVar15;
            if ((int)uVar15 < 1) {
              uVar20 = uVar19;
            }
            iVar12 = 1;
            uVar22 = 1;
            for (; uVar20 * 0x20 != uVar19; uVar19 = uVar19 + 0x20) {
              if (((&pEVar7->a[0].field_0x19)[uVar19] & 1) == 0) {
                sqlite3ErrorMsg(pParse,
                                "%r ORDER BY term does not match any column in the result set",
                                uVar22);
                goto LAB_0015aa82;
              }
              uVar22 = (ulong)((int)uVar22 + 1);
            }
          }
        }
      }
    }
  }
  return iVar12;
}

Assistant:

static int resolveSelectStep(Walker *pWalker, Select *p){
  NameContext *pOuterNC;  /* Context that contains this SELECT */
  NameContext sNC;        /* Name context of this SELECT */
  int isCompound;         /* True if p is a compound select */
  int nCompound;          /* Number of compound terms processed so far */
  Parse *pParse;          /* Parsing context */
  int i;                  /* Loop counter */
  ExprList *pGroupBy;     /* The GROUP BY clause */
  Select *pLeftmost;      /* Left-most of SELECT of a compound */
  sqlite3 *db;            /* Database connection */
  

  assert( p!=0 );
  if( p->selFlags & SF_Resolved ){
    return WRC_Prune;
  }
  pOuterNC = pWalker->u.pNC;
  pParse = pWalker->pParse;
  db = pParse->db;

  /* Normally sqlite3SelectExpand() will be called first and will have
  ** already expanded this SELECT.  However, if this is a subquery within
  ** an expression, sqlite3ResolveExprNames() will be called without a
  ** prior call to sqlite3SelectExpand().  When that happens, let
  ** sqlite3SelectPrep() do all of the processing for this SELECT.
  ** sqlite3SelectPrep() will invoke both sqlite3SelectExpand() and
  ** this routine in the correct order.
  */
  if( (p->selFlags & SF_Expanded)==0 ){
    sqlite3SelectPrep(pParse, p, pOuterNC);
    return (pParse->nErr || db->mallocFailed) ? WRC_Abort : WRC_Prune;
  }

  isCompound = p->pPrior!=0;
  nCompound = 0;
  pLeftmost = p;
  while( p ){
    assert( (p->selFlags & SF_Expanded)!=0 );
    assert( (p->selFlags & SF_Resolved)==0 );
    p->selFlags |= SF_Resolved;

    /* Resolve the expressions in the LIMIT and OFFSET clauses. These
    ** are not allowed to refer to any names, so pass an empty NameContext.
    */
    memset(&sNC, 0, sizeof(sNC));
    sNC.pParse = pParse;
    if( sqlite3ResolveExprNames(&sNC, p->pLimit) ||
        sqlite3ResolveExprNames(&sNC, p->pOffset) ){
      return WRC_Abort;
    }

    /* If the SF_Converted flags is set, then this Select object was
    ** was created by the convertCompoundSelectToSubquery() function.
    ** In this case the ORDER BY clause (p->pOrderBy) should be resolved
    ** as if it were part of the sub-query, not the parent. This block
    ** moves the pOrderBy down to the sub-query. It will be moved back
    ** after the names have been resolved.  */
    if( p->selFlags & SF_Converted ){
      Select *pSub = p->pSrc->a[0].pSelect;
      assert( p->pSrc->nSrc==1 && p->pOrderBy );
      assert( pSub->pPrior && pSub->pOrderBy==0 );
      pSub->pOrderBy = p->pOrderBy;
      p->pOrderBy = 0;
    }
  
    /* Recursively resolve names in all subqueries
    */
    for(i=0; i<p->pSrc->nSrc; i++){
      struct SrcList_item *pItem = &p->pSrc->a[i];
      if( pItem->pSelect ){
        NameContext *pNC;         /* Used to iterate name contexts */
        int nRef = 0;             /* Refcount for pOuterNC and outer contexts */
        const char *zSavedContext = pParse->zAuthContext;

        /* Count the total number of references to pOuterNC and all of its
        ** parent contexts. After resolving references to expressions in
        ** pItem->pSelect, check if this value has changed. If so, then
        ** SELECT statement pItem->pSelect must be correlated. Set the
        ** pItem->fg.isCorrelated flag if this is the case. */
        for(pNC=pOuterNC; pNC; pNC=pNC->pNext) nRef += pNC->nRef;

        if( pItem->zName ) pParse->zAuthContext = pItem->zName;
        sqlite3ResolveSelectNames(pParse, pItem->pSelect, pOuterNC);
        pParse->zAuthContext = zSavedContext;
        if( pParse->nErr || db->mallocFailed ) return WRC_Abort;

        for(pNC=pOuterNC; pNC; pNC=pNC->pNext) nRef -= pNC->nRef;
        assert( pItem->fg.isCorrelated==0 && nRef<=0 );
        pItem->fg.isCorrelated = (nRef!=0);
      }
    }
  
    /* Set up the local name-context to pass to sqlite3ResolveExprNames() to
    ** resolve the result-set expression list.
    */
    sNC.ncFlags = NC_AllowAgg;
    sNC.pSrcList = p->pSrc;
    sNC.pNext = pOuterNC;
  
    /* Resolve names in the result set. */
    if( sqlite3ResolveExprListNames(&sNC, p->pEList) ) return WRC_Abort;
  
    /* If there are no aggregate functions in the result-set, and no GROUP BY 
    ** expression, do not allow aggregates in any of the other expressions.
    */
    assert( (p->selFlags & SF_Aggregate)==0 );
    pGroupBy = p->pGroupBy;
    if( pGroupBy || (sNC.ncFlags & NC_HasAgg)!=0 ){
      assert( NC_MinMaxAgg==SF_MinMaxAgg );
      p->selFlags |= SF_Aggregate | (sNC.ncFlags&NC_MinMaxAgg);
    }else{
      sNC.ncFlags &= ~NC_AllowAgg;
    }
  
    /* If a HAVING clause is present, then there must be a GROUP BY clause.
    */
    if( p->pHaving && !pGroupBy ){
      sqlite3ErrorMsg(pParse, "a GROUP BY clause is required before HAVING");
      return WRC_Abort;
    }
  
    /* Add the output column list to the name-context before parsing the
    ** other expressions in the SELECT statement. This is so that
    ** expressions in the WHERE clause (etc.) can refer to expressions by
    ** aliases in the result set.
    **
    ** Minor point: If this is the case, then the expression will be
    ** re-evaluated for each reference to it.
    */
    sNC.pEList = p->pEList;
    if( sqlite3ResolveExprNames(&sNC, p->pHaving) ) return WRC_Abort;
    if( sqlite3ResolveExprNames(&sNC, p->pWhere) ) return WRC_Abort;

    /* Resolve names in table-valued-function arguments */
    for(i=0; i<p->pSrc->nSrc; i++){
      struct SrcList_item *pItem = &p->pSrc->a[i];
      if( pItem->fg.isTabFunc
       && sqlite3ResolveExprListNames(&sNC, pItem->u1.pFuncArg) 
      ){
        return WRC_Abort;
      }
    }

    /* The ORDER BY and GROUP BY clauses may not refer to terms in
    ** outer queries 
    */
    sNC.pNext = 0;
    sNC.ncFlags |= NC_AllowAgg;

    /* If this is a converted compound query, move the ORDER BY clause from 
    ** the sub-query back to the parent query. At this point each term
    ** within the ORDER BY clause has been transformed to an integer value.
    ** These integers will be replaced by copies of the corresponding result
    ** set expressions by the call to resolveOrderGroupBy() below.  */
    if( p->selFlags & SF_Converted ){
      Select *pSub = p->pSrc->a[0].pSelect;
      p->pOrderBy = pSub->pOrderBy;
      pSub->pOrderBy = 0;
    }

    /* Process the ORDER BY clause for singleton SELECT statements.
    ** The ORDER BY clause for compounds SELECT statements is handled
    ** below, after all of the result-sets for all of the elements of
    ** the compound have been resolved.
    **
    ** If there is an ORDER BY clause on a term of a compound-select other
    ** than the right-most term, then that is a syntax error.  But the error
    ** is not detected until much later, and so we need to go ahead and
    ** resolve those symbols on the incorrect ORDER BY for consistency.
    */
    if( isCompound<=nCompound  /* Defer right-most ORDER BY of a compound */
     && resolveOrderGroupBy(&sNC, p, p->pOrderBy, "ORDER")
    ){
      return WRC_Abort;
    }
    if( db->mallocFailed ){
      return WRC_Abort;
    }
  
    /* Resolve the GROUP BY clause.  At the same time, make sure 
    ** the GROUP BY clause does not contain aggregate functions.
    */
    if( pGroupBy ){
      struct ExprList_item *pItem;
    
      if( resolveOrderGroupBy(&sNC, p, pGroupBy, "GROUP") || db->mallocFailed ){
        return WRC_Abort;
      }
      for(i=0, pItem=pGroupBy->a; i<pGroupBy->nExpr; i++, pItem++){
        if( ExprHasProperty(pItem->pExpr, EP_Agg) ){
          sqlite3ErrorMsg(pParse, "aggregate functions are not allowed in "
              "the GROUP BY clause");
          return WRC_Abort;
        }
      }
    }

    /* If this is part of a compound SELECT, check that it has the right
    ** number of expressions in the select list. */
    if( p->pNext && p->pEList->nExpr!=p->pNext->pEList->nExpr ){
      sqlite3SelectWrongNumTermsError(pParse, p->pNext);
      return WRC_Abort;
    }

    /* Advance to the next term of the compound
    */
    p = p->pPrior;
    nCompound++;
  }

  /* Resolve the ORDER BY on a compound SELECT after all terms of
  ** the compound have been resolved.
  */
  if( isCompound && resolveCompoundOrderBy(pParse, pLeftmost) ){
    return WRC_Abort;
  }

  return WRC_Prune;
}